

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetLastItemDataForWindow(ImGuiWindow *window,ImRect *rect)

{
  float item_id;
  ImGuiItemFlags in_flags;
  bool bVar1;
  ImRect *in_RSI;
  ImVec2 *in_RDI;
  ImGuiContext *g;
  
  item_id = in_RDI[0x11].y;
  in_flags = GImGui->CurrentItemFlags;
  bVar1 = IsMouseHoveringRect(in_RDI,&in_RSI->Min,SUB81((ulong)GImGui >> 0x38,0));
  SetLastItemData((ImGuiID)item_id,in_flags,(uint)bVar1,in_RSI);
  return;
}

Assistant:

static void ImGui::SetLastItemDataForWindow(ImGuiWindow* window, const ImRect& rect)
{
    ImGuiContext& g = *GImGui;
    SetLastItemData(window->MoveId, g.CurrentItemFlags, IsMouseHoveringRect(rect.Min, rect.Max, false) ? ImGuiItemStatusFlags_HoveredRect : 0, rect);
}